

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsTextItem::paint
          (QGraphicsTextItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  QObject *object;
  QTextDocumentLayout *pQVar1;
  long in_FS_OFFSET;
  QPointF QVar2;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (**(long **)(this + 0x20) != 0) {
    QPainter::save();
    local_48.xp = (option->exposedRect).xp;
    local_48.yp = (option->exposedRect).yp;
    local_48.w = (option->exposedRect).w;
    local_48.h = (option->exposedRect).h;
    QGraphicsTextItemPrivate::controlOffset(*(QGraphicsTextItemPrivate **)(this + 0x20));
    QPainter::translate((QPointF *)painter);
    QVar2 = QGraphicsTextItemPrivate::controlOffset(*(QGraphicsTextItemPrivate **)(this + 0x20));
    local_48.xp = QVar2.xp + local_48.xp;
    local_48.yp = QVar2.yp + local_48.yp;
    QWidgetTextControl::document((QWidgetTextControl *)**(undefined8 **)(this + 0x20));
    object = (QObject *)QTextDocument::documentLayout();
    pQVar1 = QtPrivate::qobject_cast_helper<QTextDocumentLayout*,QObject>(object);
    if (pQVar1 == (QTextDocumentLayout *)0x0) {
      QWidgetTextControl::drawContents
                ((QWidgetTextControl *)**(undefined8 **)(this + 0x20),painter,&local_48,
                 (QWidget *)0x0);
    }
    else {
      QTextDocumentLayout::setViewport((QRectF *)pQVar1);
      QWidgetTextControl::drawContents
                ((QWidgetTextControl *)**(undefined8 **)(this + 0x20),painter,&local_48,
                 (QWidget *)0x0);
      QTextDocumentLayout::setViewport((QRectF *)pQVar1);
    }
    QPainter::restore();
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8100) != 0) {
    qt_graphicsItem_highlightSelected((QGraphicsItem *)(this + 0x10),painter,option);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsTextItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                              QWidget *widget)
{
    Q_UNUSED(widget);
    if (dd->control) {
        painter->save();
        QRectF r = option->exposedRect;
        painter->translate(-dd->controlOffset());
        r.translate(dd->controlOffset());

        QTextDocument *doc = dd->control->document();
        QTextDocumentLayout *layout = qobject_cast<QTextDocumentLayout *>(doc->documentLayout());

        // the layout might need to expand the root frame to
        // the viewport if NoWrap is set
        if (layout)
            layout->setViewport(dd->boundingRect);

        dd->control->drawContents(painter, r);

        if (layout)
            layout->setViewport(QRect());

        painter->restore();
    }

    if (option->state & (QStyle::State_Selected | QStyle::State_HasFocus))
        qt_graphicsItem_highlightSelected(this, painter, option);
}